

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.h
# Opt level: O1

void __thiscall
GmmLib::GmmPageTablePool::GmmPageTablePool
          (GmmPageTablePool *this,HANDLE hAlloc,GMM_RESOURCE_INFO *pGmmRes,GMM_GFX_ADDRESS SysMem,
          POOL_TYPE Type)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  uint32_t *__s;
  SyncInfo *__s_00;
  uint uVar3;
  undefined4 extraout_var_00;
  
  this->pGmmResInfo = (GMM_RESOURCE_INFO *)0x0;
  this->PoolHandle = (HANDLE)0x0;
  this->PoolGfxAddress = 0;
  this->CPUAddress = 0;
  this->NumFreeNodes = 0x200;
  this->NextPool = (GmmPageTablePool *)0x0;
  this->pClientContext = (GmmClientContext *)0x0;
  this->NodeUsage = (uint32_t *)0x0;
  this->NodeBBInfo = (SyncInfo *)0x0;
  (this->PoolBBInfo).BBQueueHandle = (HANDLE)0x0;
  (this->PoolBBInfo).BBFence = 0;
  this->PoolHandle = hAlloc;
  this->pGmmResInfo = pGmmRes;
  this->PoolGfxAddress = SysMem;
  this->CPUAddress = SysMem;
  this->NextPool = (GmmPageTablePool *)0x0;
  this->PoolType = Type;
  if (pGmmRes != (GMM_RESOURCE_INFO *)0x0) {
    iVar1 = (*(pGmmRes->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x1b])(pGmmRes);
    this->pClientContext = (GmmClientContext *)CONCAT44(extraout_var,iVar1);
  }
  if (this->pClientContext == (GmmClientContext *)0x0) {
    lVar2 = 0;
  }
  else {
    iVar1 = (*this->pClientContext->_vptr_GmmClientContext[3])();
    lVar2 = CONCAT44(extraout_var_00,iVar1);
  }
  if (Type == POOL_TYPE_AUXTTL1) {
    uVar3 = 2;
    if ((lVar2 != 0) && ((*(ulong *)(lVar2 + 0x40) >> 0x2f & 1) == 0)) {
      uVar3 = ((*(ulong *)(lVar2 + 0x40) >> 0x2e & 1) != 0) + 1;
    }
    iVar1 = (int)(0x10 / (ulong)uVar3);
  }
  else {
    iVar1 = 0x10;
    if (Type == POOL_TYPE_AUXTTL2) {
      iVar1 = 2;
    }
  }
  __s = (uint32_t *)operator_new__((ulong)(uint)(iVar1 * 4));
  if (__s == (uint32_t *)0x0) {
    __s = (uint32_t *)0x0;
  }
  else {
    memset(__s,0,(ulong)(uint)(iVar1 * 4));
  }
  this->NodeUsage = __s;
  __s_00 = (SyncInfo *)operator_new__((ulong)(uint)(iVar1 << 9));
  if (__s_00 == (SyncInfo *)0x0) {
    __s_00 = (SyncInfo *)0x0;
  }
  else {
    memset(__s_00,0,(ulong)(uint)(iVar1 << 9));
  }
  this->NodeBBInfo = __s_00;
  return;
}

Assistant:

GmmPageTablePool(HANDLE hAlloc, GMM_RESOURCE_INFO* pGmmRes, GMM_GFX_ADDRESS SysMem, POOL_TYPE Type) :
            GmmPageTablePool()
        {
            int              DwordPoolSize;
            GMM_LIB_CONTEXT *pGmmLibContext;
            PoolHandle     = hAlloc;
            pGmmResInfo    = pGmmRes;
            PoolGfxAddress = SysMem;
            CPUAddress     = PoolGfxAddress;
            NextPool       = NULL;
            NumFreeNodes   = PAGETABLE_POOL_MAX_NODES;
            PoolType       = Type;
            if(pGmmResInfo)
            {
                pClientContext = pGmmResInfo->GetGmmClientContext();
            }
            pGmmLibContext = pClientContext ? pClientContext->GetLibContext() : NULL;
            DwordPoolSize  = (Type == POOL_TYPE_AUXTTL1) ? PAGETABLE_POOL_SIZE_IN_DWORD / AUX_L1TABLE_SIZE_IN_POOLNODES_2(pGmmLibContext) : (Type == POOL_TYPE_AUXTTL2) ? PAGETABLE_POOL_SIZE_IN_DWORD / AUX_L2TABLE_SIZE_IN_POOLNODES : PAGETABLE_POOL_SIZE_IN_DWORD;
            NodeUsage      = new uint32_t[DwordPoolSize]();
            NodeBBInfo     = new SyncInfo[DwordPoolSize * 32]();
	}